

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::util_deleteCols(HModel *this,int firstcol,int lastcol)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer piVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int el;
  long lVar13;
  long lVar14;
  
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n");
  std::ostream::flush();
  lVar11 = (long)(lastcol - firstcol);
  iVar10 = this->numCol;
  pdVar3 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)firstcol;
  for (lVar14 = lVar12; lVar14 < ~(lastcol - firstcol) + iVar10; lVar14 = lVar14 + 1) {
    pdVar3[lVar14] = pdVar3[lVar11 + lVar14 + 1];
    pdVar4[lVar14] = pdVar4[lVar11 + lVar14 + 1];
    pdVar5[lVar14] = pdVar5[lVar11 + lVar14 + 1];
    pdVar6[lVar14] = pdVar6[lVar11 + lVar14 + 1];
  }
  piVar7 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar7[lVar12];
  lVar14 = (long)iVar1;
  iVar2 = piVar7[(long)lastcol + 1];
  pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar13 = (long)iVar2; lVar13 < piVar7[iVar10]; lVar13 = lVar13 + 1) {
    piVar8[lVar14] = piVar8[lVar13];
    pdVar3[lVar14] = pdVar3[lVar13];
    iVar10 = this->numCol;
    lVar14 = lVar14 + 1;
  }
  while( true ) {
    iVar9 = (int)(lVar11 + 1);
    iVar10 = iVar10 - iVar9;
    if (iVar10 < lVar12) break;
    piVar7[lVar12] = piVar7[lVar11 + 1 + lVar12] - (iVar2 - iVar1);
    lVar12 = lVar12 + 1;
    iVar10 = this->numCol;
  }
  this->numCol = iVar10;
  this->numTot = this->numTot - iVar9;
  this->mlFg_haveMatrixColWise = 0;
  this->mlFg_haveMatrixRowWise = 0;
  return;
}

Assistant:

void HModel::util_deleteCols(int firstcol, int lastcol) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  int colStep = lastcol-firstcol+1;
  for (int col = firstcol; col < numCol-colStep; col++) {
    //    printf("Copy from colCost[%d] to colCost[%d]\n", col+colStep, col);cout << flush;
    colCost[col] = colCost[col+colStep];
    colLower[col] = colLower[col+colStep];
    colUpper[col] = colUpper[col+colStep];
    colScale[col] = colScale[col+colStep];
  }
  int elOs = Astart[firstcol];
  int elStep = Astart[lastcol+1]-elOs;
  //    printf("El loop over cols %2d [%2d] to %2d [%2d]\n", lastcol+1, Astart[lastcol+1], numCol+1, Astart[numCol]-1);
  for (int el = Astart[lastcol+1]; el < Astart[numCol]; el++) {
    //        printf("Over-write entry %3d [%3d] by entry %3d [%3d]\n", el-elStep, Aindex[el-elStep], el, Aindex[el]);
    Aindex[el-elStep] = Aindex[el];
    Avalue[el-elStep] = Avalue[el];
  }
    
  for (int col = firstcol; col <= numCol-colStep; col++) {
    //    printf("Over-write start %3d [%3d] by entry %3d [%3d]\n", col, Astart[col], col+colStep,  Astart[col+colStep]-elStep);
    Astart[col] = Astart[col+colStep]-elStep;}
  
  //Reduce the number of columns and total number of variables in the model
  numCol -= colStep;
  numTot -= colStep;

  //ToDo Determine consequences for basis when deleting columns
  //Invalidate matrix copies
  mlFg_haveMatrixColWise = 0;
  mlFg_haveMatrixRowWise = 0;
}